

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_manager.hpp
# Opt level: O0

static_metric_manager<ylt::metric::ylt_default_metric_tag_t> *
ylt::metric::static_metric_manager<ylt::metric::ylt_default_metric_tag_t>::instance(void)

{
  int iVar1;
  static_metric_manager<ylt::metric::ylt_default_metric_tag_t> *__s;
  
  if (instance()::inst == '\0') {
    iVar1 = __cxa_guard_acquire(&instance()::inst);
    if (iVar1 != 0) {
      __s = (static_metric_manager<ylt::metric::ylt_default_metric_tag_t> *)operator_new(0x38);
      memset(__s,0,0x38);
      static_metric_manager
                ((static_metric_manager<ylt::metric::ylt_default_metric_tag_t> *)0x2404a7);
      instance::inst = __s;
      __cxa_guard_release(&instance()::inst);
    }
  }
  return instance::inst;
}

Assistant:

static static_metric_manager<Tag>& instance() {
    static auto* inst = new static_metric_manager<Tag>();
    return *inst;
  }